

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_remove_plugin(_func_void *plugin)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  long lVar5;
  fsnav_plugin *pfVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  fsnav_struct *pfVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  
  uVar7 = 1;
  lVar8 = 0;
  uVar11 = 0;
  cVar9 = '\0';
  pfVar10 = fsnav;
  while( true ) {
    pfVar6 = (pfVar10->core).plugins;
    sVar12 = (pfVar10->core).plugin_count;
    if (sVar12 <= uVar11) break;
    lVar5 = lVar8;
    uVar13 = uVar7;
    if (pfVar6[uVar11].func == plugin) {
      for (; pfVar6 = (pfVar10->core).plugins, uVar13 < sVar12; uVar13 = uVar13 + 1) {
        puVar2 = (undefined8 *)((long)&pfVar6->func + lVar5);
        puVar2[2] = *(undefined8 *)((long)&pfVar6[1].tick + lVar5);
        puVar3 = (undefined8 *)((long)&pfVar6[1].func + lVar5);
        uVar4 = puVar3[1];
        *puVar2 = *puVar3;
        puVar2[1] = uVar4;
        sVar12 = (pfVar10->core).plugin_count;
        lVar5 = lVar5 + 0x18;
      }
      *(undefined8 *)((long)&pfVar6->func + lVar5) = 0;
      pfVar10 = fsnav;
      pfVar6 = (fsnav->core).plugins;
      *(undefined8 *)((long)&pfVar6->cycle + lVar5) = 0;
      *(undefined4 *)((long)&pfVar6->tick + lVar5) = 0;
      psVar1 = &(pfVar10->core).plugin_count;
      *psVar1 = *psVar1 - 1;
      cVar9 = cVar9 + '\x01';
    }
    uVar11 = uVar11 + 1;
    lVar8 = lVar8 + 0x18;
    uVar7 = uVar7 + 1;
  }
  pfVar6 = (fsnav_plugin *)realloc(pfVar6,sVar12 * 0x18);
  if ((pfVar6 == (fsnav_plugin *)0x0) && ((fsnav->core).plugin_count != 0)) {
    fsnav_free();
    cVar9 = '\0';
  }
  else {
    (fsnav->core).plugins = pfVar6;
  }
  return cVar9;
}

Assistant:

char fsnav_remove_plugin(void(*plugin)(void))
{
	size_t       i, j;
	char         flag = 0;
	fsnav_plugin* reallocated_pointer;

	for (i = 0; i < fsnav->core.plugin_count; i++) { // go through the execution list
		if (fsnav->core.plugins[i].func != plugin)   // if not the requested plugin, do nothing
			continue;
		// otherwise, remove the current plugin from the execution list
		for (j = i+1; j < fsnav->core.plugin_count; j++) // copy all succeeding plugins one position lower
			fsnav->core.plugins[j-1] = fsnav->core.plugins[j];
		// reset the last one
		j--;
		fsnav->core.plugins[j].func  = NULL;
		fsnav->core.plugins[j].cycle = 0;
		fsnav->core.plugins[j].shift = 0;
		fsnav->core.plugins[j].tick  = 0;
		fsnav->core.plugin_count--;
		if (flag < 0xff)
			flag++;
	}

	// reallocate memory
	reallocated_pointer = (fsnav_plugin*)realloc((void*)(fsnav->core.plugins), fsnav->core.plugin_count*sizeof(fsnav_plugin));
	if (fsnav->core.plugin_count > 0 && reallocated_pointer == NULL) { // memory reallocation somehow failed
		fsnav_free();
		return 0;
	}
	fsnav->core.plugins = reallocated_pointer;

	return flag;
}